

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *this_00;
  long *in_RSI;
  undefined8 *in_RDI;
  TypeClusterList *tcl;
  TypeCluster *tc;
  Index typeIndex;
  Index agI;
  size_t nrAgents;
  undefined4 in_stack_ffffffffffffff38;
  Index in_stack_ffffffffffffff3c;
  TypeCluster *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff48;
  value_type *in_stack_ffffffffffffff50;
  value_type *__value;
  size_type in_stack_ffffffffffffff58;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *in_stack_ffffffffffffff60;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff98;
  BayesianGameForDecPOMDPStage *in_stack_ffffffffffffffa0;
  undefined1 local_51 [9];
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *local_48;
  undefined4 local_40;
  uint local_3c;
  ulong local_38;
  undefined8 local_28;
  long *local_10;
  
  local_10 = in_RSI;
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDI = &PTR__BayesianGameWithClusterInfo_00d06ad0;
  in_RDI[4] = &PTR__BayesianGameWithClusterInfo_00d06b20;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8bb480);
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  boost::shared_ptr<const_JointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<const_JointPolicyDiscretePure> *)0x8bb4ac);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8bb4c2);
  (**(code **)(*local_10 + 0x30))();
  local_28 = 0;
  std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>::allocator
            ((allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*> *)0x8bb508);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
           in_stack_ffffffffffffff48);
  std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>::~allocator
            ((allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*> *)0x8bb533);
  in_RDI[0x37] = 0;
  in_RDI[0x38] = 0;
  local_38 = (**(code **)(*local_10 + 0x30))();
  for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
    local_40 = 0;
    this_00 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)operator_new(0x38);
    TypeCluster::TypeCluster(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    local_48 = this_00;
    in_stack_ffffffffffffff40 = (TypeCluster *)operator_new(0x18);
    __value = (value_type *)local_51;
    std::allocator<TypeCluster_*>::allocator((allocator<TypeCluster_*> *)0x8bb5f4);
    std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector
              (this_00,(size_type)in_stack_ffffffffffffff40,__value,
               (allocator_type *)in_stack_ffffffffffffff48);
    std::allocator<TypeCluster_*>::~allocator((allocator<TypeCluster_*> *)0x8bb621);
    local_51._1_8_ = in_stack_ffffffffffffff40;
    in_stack_ffffffffffffff48 =
         (allocator_type *)
         std::
         vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
         ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)in_stack_ffffffffffffff40,
              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    *(TypeCluster **)in_stack_ffffffffffffff48 = in_stack_ffffffffffffff40;
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu
    )
        :
    BayesianGameForDecPOMDPStage(  pu )
    , _m_pBG()
    , _m_qJB(0)
    , _m_qHybrid(0)
    , _m_pBGJPol()
    , _m_typeLists(pu->GetNrAgents(), 0),
    _m_thresholdJB(0),
    _m_thresholdPjaoh(0)

{
    size_t nrAgents = pu->GetNrAgents();
    for(Index agI=0; agI < nrAgents; agI++)
    {
        //remember things are defined as follows:
        //typedef std::vector<TypeCluster* > TypeClusterList
        //std::vector< TypeClusterList* > _m_typeLists;
        Index typeIndex = 0;
        TypeCluster* tc = new TypeCluster( typeIndex );
        TypeClusterList* tcl =  new TypeClusterList(1, tc);
        _m_typeLists.at(agI) = tcl;
    }
}